

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void __thiscall
ExpressionContext::PushLoopScope(ExpressionContext *this,bool allowBreak,bool allowContinue)

{
  uint uniqueId;
  int iVar1;
  undefined4 extraout_var;
  ScopeData *next;
  ScopeData *this_00;
  
  iVar1 = (*this->allocator->_vptr_Allocator[2])(this->allocator,400);
  this_00 = (ScopeData *)CONCAT44(extraout_var,iVar1);
  uniqueId = this->uniqueScopeId;
  this->uniqueScopeId = uniqueId + 1;
  ScopeData::ScopeData(this_00,this->allocator,this->scope,uniqueId,SCOPE_LOOP);
  next = this_00;
  if (this->scope != (ScopeData *)0x0) {
    SmallArray<ScopeData_*,_2U>::push_back(&this->scope->scopes,&next);
    next->startOffset = this->scope->dataSize;
  }
  if (allowBreak) {
    next->breakDepth = next->breakDepth + 1;
  }
  if (allowContinue) {
    next->contiueDepth = next->contiueDepth + 1;
  }
  this->scope = next;
  if (this->lookupLocation != (SynBase *)0x0) {
    next->unrestricted = true;
  }
  return;
}

Assistant:

void ExpressionContext::PushLoopScope(bool allowBreak, bool allowContinue)
{
	ScopeData *next = new (get<ScopeData>()) ScopeData(allocator, scope, uniqueScopeId++, SCOPE_LOOP);

	if(scope)
	{
		scope->scopes.push_back(next);

		next->startOffset = scope->dataSize;
	}

	if(allowBreak)
		next->breakDepth++;

	if(allowContinue)
		next->contiueDepth++;

	scope = next;

	if(lookupLocation)
		scope->unrestricted = true;
}